

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockableVector.hpp
# Opt level: O0

void __thiscall
LockableVector<int>::LockableVector(LockableVector<int> *this,LockableVector<int> *lv)

{
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  condition_variable *this_00;
  undefined1 *__n;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29 [25];
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1112f4);
  std::mutex::mutex((mutex *)0x111302);
  this_00 = (condition_variable *)(in_RDI + 0x40);
  std::condition_variable::condition_variable(this_00);
  __a = (allocator_type *)std::vector<int,_std::allocator<int>_>::size(local_10);
  __n = local_29;
  std::allocator<int>::allocator((allocator<int> *)0x111333);
  std::vector<int,_std::allocator<int>_>::vector(in_stack_ffffffffffffffc0,(size_type)__n,__a);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)__a,(vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  std::allocator<int>::~allocator((allocator<int> *)0x11136b);
  return;
}

Assistant:

LockableVector (LockableVector &&lv) {
		dataVector	= std::vector<T> (lv.dataVector.size());
	}